

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5RollbackToMethod(sqlite3_vtab *pVtab,int iSavepoint)

{
  int iVar1;
  _func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int *p_Var2;
  
  for (p_Var2 = (pVtab[2].pModule)->xColumn;
      p_Var2 != (_func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int *)0x0;
      p_Var2 = *(_func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int **)(p_Var2 + 8)) {
    if ((*(int *)(p_Var2 + 0x20) == 1) && (*(sqlite3_vtab **)p_Var2 == pVtab)) {
      p_Var2[0x50] = (_func_int_sqlite3_vtab_cursor_ptr_sqlite3_context_ptr_int)
                     ((byte)p_Var2[0x50] | 0x20);
    }
  }
  if (iSavepoint < *(int *)&pVtab[2].zErrMsg) {
    *(undefined4 *)((long)&(pVtab[1].pModule)->xIntegrity + 4) = 0;
    iVar1 = sqlite3Fts5StorageRollback((Fts5Storage *)pVtab[1].zErrMsg);
    return iVar1;
  }
  return 0;
}

Assistant:

static void fts5TripCursors(Fts5FullTable *pTab){
  Fts5Cursor *pCsr;
  for(pCsr=pTab->pGlobal->pCsr; pCsr; pCsr=pCsr->pNext){
    if( pCsr->ePlan==FTS5_PLAN_MATCH
     && pCsr->base.pVtab==(sqlite3_vtab*)pTab
    ){
      CsrFlagSet(pCsr, FTS5CSR_REQUIRE_RESEEK);
    }
  }
}